

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

QList<QSimplexConstraint_*> * __thiscall
QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints
          (QList<QSimplexConstraint_*> *__return_storage_ptr__,QGraphicsAnchorLayoutPrivate *this,
          QList<QtGraphicsAnchorLayout::AnchorData_*> *anchors)

{
  double dVar1;
  AnchorData *pAVar2;
  bool bVar3;
  AnchorData *pAVar4;
  qreal *pqVar5;
  parameter_type pQVar6;
  AnchorVertex *second;
  bool bVar7;
  int i;
  AnchorData *pAVar8;
  uint uVar9;
  long in_FS_OFFSET;
  qreal qVar10;
  qreal p2;
  double local_48;
  QSimplexVariable *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anchors->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0055f565;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    uVar9 = (byte)(*(anchors->d).ptr)->field_0x78 >> 4 & 1;
    second = (this->layoutCentralVertex).m_data[uVar9];
    if (second == (AnchorVertex *)0x0) {
      second = (this->layoutLastVertex).m_data[uVar9];
    }
    pAVar4 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
             edgeData((this->graph).m_data + uVar9,(this->layoutFirstVertex).m_data[uVar9],second);
    if (pAVar4->from == (this->layoutFirstVertex).m_data[uVar9]) {
      qVar10 = pAVar4->maxSize;
    }
    else {
      qVar10 = -pAVar4->minSize;
    }
    pAVar8 = (AnchorData *)0x0;
    if (qVar10 != *(double *)
                   (&DAT_006768a0 +
                   (ulong)((this->layoutCentralVertex).m_data[uVar9] == (AnchorVertex *)0x0) * 8)) {
      pAVar4 = pAVar8;
    }
    if (NAN(qVar10) ||
        NAN(*(double *)
             (&DAT_006768a0 +
             (ulong)((this->layoutCentralVertex).m_data[uVar9] == (AnchorVertex *)0x0) * 8))) {
      pAVar4 = pAVar8;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QSimplexConstraint **)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar7 = true;
    for (; pAVar8 < (AnchorData *)(anchors->d).size;
        pAVar8 = (AnchorData *)((long)&pAVar8->_vptr_AnchorData + 1)) {
      pAVar2 = (anchors->d).ptr[(long)pAVar8];
      if ((pAVar2->field_0x78 & 0x60) != 0x40) {
        dVar1 = pAVar2->minSize;
        if ((16777215.0 < dVar1) || (qVar10 = -16777215.0, -16777215.0 < dVar1)) {
          pqVar5 = (qreal *)&g_offset;
          if (dVar1 <= 16777215.0) {
            pqVar5 = &pAVar2->minSize;
          }
          qVar10 = *pqVar5;
        }
        dVar1 = pAVar2->maxSize;
        if ((16777215.0 < dVar1) || (p2 = -16777215.0, -16777215.0 < dVar1)) {
          pqVar5 = (qreal *)&g_offset;
          if (dVar1 <= 16777215.0) {
            pqVar5 = &pAVar2->maxSize;
          }
          p2 = *pqVar5;
        }
        if (((qVar10 == p2) && (!NAN(qVar10) && !NAN(p2))) ||
           (bVar3 = qFuzzyCompare(qVar10,p2), bVar3)) {
          pQVar6 = (parameter_type)operator_new(0x30);
          (pQVar6->variables).d = (Data *)0x0;
          pQVar6->constant = 0.0;
          pQVar6->ratio = Equal;
          pQVar6->artificial = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).second = 0.0;
          local_40 = &pAVar2->super_QSimplexVariable;
          local_48 = 1.0;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar6,&local_40,&local_48);
          pQVar6->constant = qVar10;
          pQVar6->ratio = Equal;
        }
        else {
          pQVar6 = (parameter_type)operator_new(0x30);
          (pQVar6->variables).d = (Data *)0x0;
          pQVar6->constant = 0.0;
          pQVar6->ratio = Equal;
          pQVar6->artificial = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).second = 0.0;
          local_48 = 1.0;
          local_40 = &pAVar2->super_QSimplexVariable;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar6,&local_40,&local_48);
          pQVar6->constant = qVar10;
          pQVar6->ratio = MoreOrEqual;
          QList<QSimplexConstraint_*>::append(__return_storage_ptr__,pQVar6);
          if (pAVar2 == pAVar4) goto LAB_0055f3de;
          pQVar6 = (parameter_type)operator_new(0x30);
          (pQVar6->variables).d = (Data *)0x0;
          pQVar6->constant = 0.0;
          pQVar6->ratio = Equal;
          pQVar6->artificial = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).first = (QConcreteSimplexVariable *)0x0;
          (pQVar6->helper).second = 0.0;
          local_48 = 1.0;
          local_40 = &pAVar2->super_QSimplexVariable;
          QHash<QSimplexVariable*,double>::emplace<double_const&>
                    ((QHash<QSimplexVariable*,double> *)pQVar6,&local_40,&local_48);
          pQVar6->constant = p2;
          pQVar6->ratio = LessOrEqual;
        }
        QList<QSimplexConstraint_*>::append(__return_storage_ptr__,pQVar6);
        bVar7 = false;
      }
LAB_0055f3de:
    }
    if (bVar7) {
      pQVar6 = (parameter_type)operator_new(0x30);
      (pQVar6->variables).d = (Data *)0x0;
      pQVar6->constant = 0.0;
      pQVar6->ratio = Equal;
      (pQVar6->helper).first = (QConcreteSimplexVariable *)0x0;
      (pQVar6->helper).second = 0.0;
      pQVar6->artificial = (QConcreteSimplexVariable *)0x0;
      local_40 = &pAVar4->super_QSimplexVariable;
      if (pAVar4 == (AnchorData *)0x0) {
        local_40 = (QSimplexVariable *)0x0;
      }
      local_48 = 1.0;
      QHash<QSimplexVariable*,double>::emplace<double_const&>
                ((QHash<QSimplexVariable*,double> *)pQVar6,&local_40,&local_48);
      pQVar6->constant = 16777215.0;
      pQVar6->ratio = LessOrEqual;
      QList<QSimplexConstraint_*>::append(__return_storage_ptr__,pQVar6);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0055f565:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QSimplexConstraint *> QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints(
    const QList<AnchorData *> &anchors)
{
    if (anchors.isEmpty())
        return QList<QSimplexConstraint *>();

    // Look for the layout edge. That can be either the first half in case the
    // layout is split in two, or the whole layout anchor.
    const Qt::Orientation orient = anchors.first()->isVertical ? Qt::Vertical : Qt::Horizontal;
    AnchorData *layoutEdge = nullptr;
    if (layoutCentralVertex[orient]) {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutCentralVertex[orient]);
    } else {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutLastVertex[orient]);
    }

    // If maxSize is less then "infinite", that means there are other anchors
    // grouped together with this one. We can't ignore its maximum value so we
    // set back the variable to NULL to prevent the continue condition from being
    // satisfied in the loop below.
    const qreal expectedMax = layoutCentralVertex[orient] ? QWIDGETSIZE_MAX / 2 : QWIDGETSIZE_MAX;
    qreal actualMax;
    if (layoutEdge->from == layoutFirstVertex[orient]) {
        actualMax = layoutEdge->maxSize;
    } else {
        actualMax = -layoutEdge->minSize;
    }
    if (actualMax != expectedMax) {
        layoutEdge = nullptr;
    }

    // For each variable, create constraints based on size hints
    QList<QSimplexConstraint *> anchorConstraints;
    bool unboundedProblem = true;
    for (int i = 0; i < anchors.size(); ++i) {
        AnchorData *ad = anchors.at(i);

        // Anchors that have their size directly linked to another one don't need constraints
        // For exammple, the second half of an item has exactly the same size as the first half
        // thus constraining the latter is enough.
        if (ad->dependency == AnchorData::Slave)
            continue;

        // To use negative variables inside simplex, we shift them so the minimum negative value is
        // mapped to zero before solving. To make sure that it works, we need to guarantee that the
        // variables are all inside a certain boundary.
        qreal boundedMin = qBound(-g_offset, ad->minSize, g_offset);
        qreal boundedMax = qBound(-g_offset, ad->maxSize, g_offset);

        if ((boundedMin == boundedMax) || qFuzzyCompare(boundedMin, boundedMax)) {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::Equal;
            anchorConstraints += c;
            unboundedProblem = false;
        } else {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::MoreOrEqual;
            anchorConstraints += c;

            // We avoid adding restrictions to the layout internal anchors. That's
            // to prevent unnecessary fair distribution from happening due to this
            // artificial restriction.
            if (ad == layoutEdge)
                continue;

            c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMax;
            c->ratio = QSimplexConstraint::LessOrEqual;
            anchorConstraints += c;
            unboundedProblem = false;
        }
    }

    // If no upper boundary restriction was added, add one to avoid unbounded problem
    if (unboundedProblem) {
        QSimplexConstraint *c = new QSimplexConstraint;
        c->variables.insert(layoutEdge, 1.0);
        // The maximum size that the layout can take
        c->constant = g_offset;
        c->ratio = QSimplexConstraint::LessOrEqual;
        anchorConstraints += c;
    }

    return anchorConstraints;
}